

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

int __thiscall re2::Compiler::AddSuffixRecursive(Compiler *this,int root,int id)

{
  Inst *pIVar1;
  InstOp IVar2;
  int foldcase;
  uint32 out_00;
  int iVar3;
  int iVar4;
  Frag a;
  bool bVar5;
  int out;
  int byterange;
  int br;
  int alt;
  PatchList PStack_24;
  Frag f;
  int id_local;
  int root_local;
  Compiler *this_local;
  
  IVar2 = Prog::Inst::opcode(this->inst_ + root);
  bVar5 = true;
  if (IVar2 != kInstAlt) {
    IVar2 = Prog::Inst::opcode(this->inst_ + root);
    bVar5 = IVar2 == kInstByteRange;
  }
  if (bVar5) {
    a = FindByteRange(this,root,id);
    bVar5 = IsNoMatch(a);
    if (bVar5) {
      this_local._4_4_ = AllocInst(this,1);
      if ((int)this_local._4_4_ < 0) {
        this_local._4_4_ = 0;
      }
      else {
        Prog::Inst::InitAlt(this->inst_ + (int)this_local._4_4_,root,id);
      }
    }
    else {
      PStack_24 = a.end.p;
      out = root;
      if (PStack_24.p != 0) {
        if (((ulong)a & 0x100000000) == 0) {
          out = Prog::Inst::out(this->inst_ + ((ulong)a & 0xffffffff));
        }
        else {
          out = Prog::Inst::out1(this->inst_ + ((ulong)a & 0xffffffff));
        }
      }
      bVar5 = IsCachedRuneByteSuffix(this,out);
      f.end.p = root;
      if (bVar5) {
        f.end.p = AllocInst(this,1);
        if ((int)f.end.p < 0) {
          return 0;
        }
        pIVar1 = this->inst_;
        iVar3 = Prog::Inst::lo(this->inst_ + out);
        iVar4 = Prog::Inst::hi(this->inst_ + out);
        foldcase = Prog::Inst::foldcase(this->inst_ + out);
        out_00 = Prog::Inst::out(this->inst_ + out);
        Prog::Inst::InitByteRange(pIVar1 + (int)f.end.p,iVar3,iVar4,foldcase,out_00);
        out = f.end.p;
        if (PStack_24.p != 0) {
          if (((ulong)a & 0x100000000) == 0) {
            Prog::Inst::set_out(this->inst_ + ((ulong)a & 0xffffffff),f.end.p);
            f.end.p = root;
          }
          else {
            this->inst_[(ulong)a & 0xffffffff].field_1.cap_ = f.end.p;
            f.end.p = root;
          }
        }
      }
      iVar3 = Prog::Inst::out(this->inst_ + id);
      bVar5 = IsCachedRuneByteSuffix(this,id);
      if (!bVar5) {
        if (id != this->inst_len_ + -1) {
          __assert_fail("(id) == (inst_len_-1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc"
                        ,0x23f,"int re2::Compiler::AddSuffixRecursive(int, int)");
        }
        this->inst_[id].out_opcode_ = 0;
        this->inst_[id].field_1.out1_ = 0;
        this->inst_len_ = this->inst_len_ + -1;
      }
      iVar4 = Prog::Inst::out(this->inst_ + out);
      iVar3 = AddSuffixRecursive(this,iVar4,iVar3);
      if (iVar3 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        Prog::Inst::set_out(this->inst_ + out,iVar3);
        this_local._4_4_ = f.end.p;
      }
    }
    return this_local._4_4_;
  }
  __assert_fail("inst_[root].opcode() == kInstAlt || inst_[root].opcode() == kInstByteRange",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",
                0x215,"int re2::Compiler::AddSuffixRecursive(int, int)");
}

Assistant:

int Compiler::AddSuffixRecursive(int root, int id) {
  DCHECK(inst_[root].opcode() == kInstAlt ||
         inst_[root].opcode() == kInstByteRange);

  Frag f = FindByteRange(root, id);
  if (IsNoMatch(f)) {
    int alt = AllocInst(1);
    if (alt < 0)
      return 0;
    inst_[alt].InitAlt(root, id);
    return alt;
  }

  int br;
  if (f.end.p == 0)
    br = root;
  else if (f.end.p&1)
    br = inst_[f.begin].out1();
  else
    br = inst_[f.begin].out();

  if (IsCachedRuneByteSuffix(br)) {
    // We can't fiddle with cached suffixes, so make a clone of the head.
    int byterange = AllocInst(1);
    if (byterange < 0)
      return 0;
    inst_[byterange].InitByteRange(inst_[br].lo(), inst_[br].hi(),
                                   inst_[br].foldcase(), inst_[br].out());

    // Ensure that the parent points to the clone, not to the original.
    // Note that this could leave the head unreachable except via the cache.
    br = byterange;
    if (f.end.p == 0)
      root = br;
    else if (f.end.p&1)
      inst_[f.begin].out1_ = br;
    else
      inst_[f.begin].set_out(br);
  }

  int out = inst_[id].out();
  if (!IsCachedRuneByteSuffix(id)) {
    // The head should be the instruction most recently allocated, so free it
    // instead of leaving it unreachable.
    DCHECK_EQ(id, inst_len_-1);
    inst_[id].out_opcode_ = 0;
    inst_[id].out1_ = 0;
    inst_len_--;
  }

  out = AddSuffixRecursive(inst_[br].out(), out);
  if (out == 0)
    return 0;

  inst_[br].set_out(out);
  return root;
}